

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O3

int coda_type_record_field_set_bit_offset_expression
              (coda_type_record_field *field,coda_expression *bit_offset_expr)

{
  coda_format cVar1;
  uint uVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  if (field == (coda_type_record_field *)0x0) {
    pcVar4 = "field argument is NULL (%s:%u)";
    uVar3 = 0x472;
  }
  else {
    if (bit_offset_expr != (coda_expression *)0x0) {
      if (field->bit_offset_expr != (coda_expression *)0x0) {
        coda_set_error(-400,"field already has a bit offset expression");
        return -1;
      }
      cVar1 = field->type->format;
      if (coda_format_binary < cVar1) {
        uVar2 = cVar1 - coda_format_xml;
        if (uVar2 < 8) {
          pcVar4 = &DAT_001923b0 + *(int *)(&DAT_001923b0 + (ulong)uVar2 * 4);
        }
        else {
          pcVar4 = "unknown";
        }
        coda_set_error(-400,"bit offset expression not allowed for record field with %s format",
                       pcVar4);
        return -1;
      }
      field->bit_offset_expr = bit_offset_expr;
      return 0;
    }
    pcVar4 = "bit_offset_expr argument is NULL (%s:%u)";
    uVar3 = 0x477;
  }
  coda_set_error(-100,pcVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                 ,uVar3);
  return -1;
}

Assistant:

int coda_type_record_field_set_bit_offset_expression(coda_type_record_field *field, coda_expression *bit_offset_expr)
{
    if (field == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "field argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (bit_offset_expr == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "bit_offset_expr argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (field->bit_offset_expr != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "field already has a bit offset expression");
        return -1;
    }
    if (field->type->format != coda_format_ascii && field->type->format != coda_format_binary)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "bit offset expression not allowed for record field with %s format",
                       coda_type_get_format_name(field->type->format));
        return -1;
    }
    field->bit_offset_expr = bit_offset_expr;
    return 0;
}